

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::ArenaTest_SetAllocatedString_Test::TestBody
          (ArenaTest_SetAllocatedString_Test *this)

{
  void *pvVar1;
  string *value;
  Arena *arena_00;
  pointer *__ptr;
  char *message;
  AssertionResult gtest_ar;
  Arena arena;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  AssertHelper local_d0;
  internal local_c8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c0;
  ThreadSafeArena local_b8;
  
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&local_b8);
  pvVar1 = Arena::DefaultConstruct<proto2_unittest::TestAllTypes>((Arena *)&local_b8);
  value = (string *)operator_new(0x20);
  (value->_M_dataplus)._M_p = (pointer)&value->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)value,"hello","");
  *(byte *)((long)pvVar1 + 0x10) = *(byte *)((long)pvVar1 + 0x10) | 1;
  arena_00 = *(Arena **)((long)pvVar1 + 8);
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::SetAllocated
            ((ArenaStringPtr *)((long)pvVar1 + 0x1f8),value,arena_00);
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            (local_c8,"\"hello\"","arena_message->optional_string()",(char (*) [6])0x1262809,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)(((ArenaStringPtr *)((long)pvVar1 + 0x1f8))->tagged_ptr_).ptr_ &
             0xfffffffffffffffc));
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d8);
    if (local_c0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_c0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x315,message);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    if (local_d8._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_d8._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_c0,local_c0);
  }
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&local_b8);
  return;
}

Assistant:

TEST(ArenaTest, SetAllocatedString) {
  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  std::string* allocated_str = new std::string("hello");
  arena_message->set_allocated_optional_string(allocated_str);
  EXPECT_EQ("hello", arena_message->optional_string());
}